

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# affine.c
# Opt level: O0

void glmc_rotated_at(vec4 *m,float *pivot,float angle,float *axis)

{
  undefined8 uVar1;
  float *in_RDX;
  float *in_RSI;
  undefined8 *in_RDI;
  float in_XMM0_Da;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  __m128 afVar2;
  __m128 a;
  __m128 a_00;
  __m128 a_01;
  __m128 a_02;
  __m128 a_03;
  __m128 b;
  __m128 b_00;
  __m128 b_01;
  __m128 b_02;
  __m128 b_03;
  __m128 b_04;
  __m128 c_00;
  __m128 c_01;
  __m128 c_02;
  __m128 c_03;
  __m128 c_04;
  __m128 c_05;
  vec3 pivotInv;
  mat4 rot;
  float c;
  vec3 vs;
  vec3 v;
  vec3 axisn;
  float norm;
  __m128 v2;
  __m128 v1;
  __m128 v0;
  __m128 r2;
  __m128 r1;
  __m128 r0;
  __m128 l;
  float local_4e8;
  float local_4e4;
  float local_4e0;
  undefined8 *local_4c0;
  float local_498 [4];
  undefined8 local_488 [8];
  undefined8 *local_448;
  float local_43c;
  float local_438;
  float local_434;
  float local_430;
  float local_428;
  float local_424;
  float local_420;
  float local_418;
  float local_414;
  float local_410;
  float *local_408;
  float local_3fc;
  float *local_3f8;
  undefined8 *local_3f0;
  undefined8 *local_3e8;
  float *local_3e0;
  float local_3d4;
  float *local_3d0;
  float *local_3c8;
  float *local_3c0;
  float local_3b4;
  float *local_3b0;
  float *local_3a8;
  float local_39c;
  float *local_398;
  float *local_390;
  float local_384;
  float *local_380;
  float *local_378;
  float local_36c;
  float *local_368;
  float *local_360;
  float local_354;
  float *local_350;
  float *local_348;
  float local_33c;
  float *local_338;
  float *local_330;
  float *local_328;
  float *local_320;
  float *local_318;
  float *local_310;
  float *local_308;
  float *local_2e0;
  float *local_2d0;
  undefined8 local_2c8;
  float fStack_2c0;
  float fStack_2bc;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 *local_250;
  undefined8 *local_248;
  float *local_240;
  float *local_1b8;
  undefined8 *local_1b0;
  undefined8 *local_1a8;
  undefined8 *local_1a0;
  undefined8 *local_198;
  float *local_190;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_158;
  undefined8 uStack_150;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined4 local_128;
  undefined4 uStack_124;
  undefined4 uStack_120;
  undefined4 uStack_11c;
  undefined4 local_118;
  undefined4 uStack_114;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  undefined4 local_108;
  undefined4 uStack_104;
  undefined4 uStack_100;
  undefined4 uStack_fc;
  undefined4 local_f8;
  undefined4 uStack_f4;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  undefined4 local_e8;
  undefined4 uStack_e4;
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  undefined4 local_d8;
  undefined4 uStack_d4;
  undefined4 uStack_d0;
  undefined4 uStack_cc;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  local_308 = &local_4e8;
  local_4e8 = -*in_RSI;
  local_4e4 = -in_RSI[1];
  local_4e0 = -in_RSI[2];
  local_2d0 = (float *)(in_RDI + 6);
  local_2e0 = (float *)(in_RDI + 6);
  *local_2e0 = *local_2d0 + *in_RSI;
  *(float *)((long)in_RDI + 0x34) = *(float *)((long)in_RDI + 0x34) + in_RSI[1];
  *(float *)(in_RDI + 7) = *(float *)(in_RDI + 7) + in_RSI[2];
  local_3f8 = local_498;
  local_4c0 = in_RDI;
  local_448 = in_RDI;
  local_408 = in_RDX;
  local_3fc = in_XMM0_Da;
  local_43c = cosf(in_XMM0_Da);
  local_3c8 = local_408;
  local_3d0 = &local_418;
  local_330 = local_408;
  local_320 = local_408;
  local_310 = local_408;
  local_318 = local_408;
  local_3d4 = sqrtf(local_408[2] * local_408[2] +
                    *local_408 * *local_408 + local_408[1] * local_408[1]);
  if (local_3d4 < 1.1920929e-07) {
    local_328 = local_3d0;
    local_3d0[2] = 0.0;
    local_328[1] = 0.0;
    *local_328 = 0.0;
  }
  else {
    local_3b4 = 1.0 / local_3d4;
    local_3b0 = local_3c8;
    local_3c0 = local_3d0;
    *local_3d0 = *local_3c8 * local_3b4;
    local_3c0[1] = local_3b0[1] * local_3b4;
    local_3c0[2] = local_3b0[2] * local_3b4;
  }
  local_33c = 1.0 - local_43c;
  local_348 = &local_428;
  local_428 = local_418 * local_33c;
  local_424 = local_414 * local_33c;
  local_420 = local_410 * local_33c;
  local_338 = &local_418;
  local_354 = sinf(local_3fc);
  local_360 = &local_438;
  local_438 = local_418 * local_354;
  local_434 = local_414 * local_354;
  local_430 = local_410 * local_354;
  local_36c = local_428;
  local_378 = local_3f8;
  local_368 = &local_418;
  local_350 = &local_418;
  *local_3f8 = local_418 * local_428;
  local_378[1] = local_368[1] * local_36c;
  local_378[2] = local_368[2] * local_36c;
  local_390 = local_3f8 + 4;
  local_384 = local_424;
  local_380 = &local_418;
  *local_390 = local_418 * local_424;
  local_390[1] = local_380[1] * local_384;
  local_390[2] = local_380[2] * local_384;
  local_3a8 = local_3f8 + 8;
  local_39c = local_420;
  local_398 = &local_418;
  *local_3a8 = local_418 * local_420;
  local_3a8[1] = local_398[1] * local_39c;
  local_3a8[2] = local_398[2] * local_39c;
  *local_3f8 = *local_3f8 + local_43c;
  local_3f8[4] = local_3f8[4] - local_430;
  local_3f8[8] = local_3f8[8] + local_434;
  local_3f8[1] = local_3f8[1] + local_430;
  local_3f8[5] = local_3f8[5] + local_43c;
  local_3f8[9] = local_3f8[9] - local_438;
  local_3f8[2] = local_3f8[2] - local_434;
  local_3f8[6] = local_3f8[6] + local_438;
  local_3f8[10] = local_3f8[10] + local_43c;
  local_3f8[0xe] = 0.0;
  local_3f8[0xd] = 0.0;
  local_3f8[0xc] = 0.0;
  local_3f8[0xb] = 0.0;
  local_3f8[7] = 0.0;
  local_3f8[3] = 0.0;
  local_3f8[0xf] = 1.0;
  local_3e0 = local_498;
  local_3e8 = local_448;
  local_3f0 = local_448;
  local_248 = local_448;
  local_250 = local_448;
  local_198 = local_448;
  local_278 = *local_448;
  uStack_270 = local_448[1];
  local_1a0 = local_448 + 2;
  local_288 = *local_1a0;
  uStack_280 = local_448[3];
  local_1a8 = local_448 + 4;
  local_298 = *local_1a8;
  uStack_290 = local_448[5];
  local_18._0_4_ = (float)local_278;
  local_a8 = (float)local_18;
  fStack_a4 = (float)local_18;
  fStack_a0 = (float)local_18;
  fStack_9c = (float)local_18;
  local_138 = CONCAT44((float)local_18,(float)local_18);
  uStack_130 = CONCAT44((float)local_18,(float)local_18);
  local_148 = (float)local_498._0_8_;
  fStack_144 = SUB84(local_498._0_8_,4);
  fStack_140 = (float)local_498._8_8_;
  fStack_13c = SUB84(local_498._8_8_,4);
  local_2a8 = CONCAT44((float)local_18 * fStack_144,(float)local_18 * local_148);
  uStack_2a0 = CONCAT44((float)local_18 * fStack_13c,(float)local_18 * fStack_140);
  local_28._0_4_ = (float)local_288;
  local_b8 = (float)local_28;
  fStack_b4 = (float)local_28;
  fStack_b0 = (float)local_28;
  fStack_ac = (float)local_28;
  local_158 = CONCAT44((float)local_28,(float)local_28);
  uStack_150 = CONCAT44((float)local_28,(float)local_28);
  local_2b8 = CONCAT44((float)local_28 * fStack_144,(float)local_28 * local_148);
  uStack_2b0 = CONCAT44((float)local_28 * fStack_13c,(float)local_28 * fStack_140);
  local_38._0_4_ = (float)local_298;
  local_c8 = (float)local_38;
  fStack_c4 = (float)local_38;
  fStack_c0 = (float)local_38;
  fStack_bc = (float)local_38;
  local_178 = CONCAT44((float)local_38,(float)local_38);
  uStack_170 = CONCAT44((float)local_38,(float)local_38);
  local_2c8 = CONCAT44((float)local_38 * fStack_144,(float)local_38 * local_148);
  _fStack_2c0 = CONCAT44((float)local_38 * fStack_13c,(float)local_38 * fStack_140);
  local_1b0 = local_488;
  local_268 = local_488[0];
  local_48._4_4_ = (undefined4)((ulong)local_278 >> 0x20);
  local_d8 = local_48._4_4_;
  uStack_d4 = local_48._4_4_;
  uStack_d0 = local_48._4_4_;
  uStack_cc = local_48._4_4_;
  afVar2[1] = (float)local_48._4_4_;
  afVar2[0] = (float)local_48._4_4_;
  afVar2[2] = (float)(undefined4)local_488[0];
  afVar2[3] = (float)local_488[0]._4_4_;
  b[2] = (float)(int)in_XMM3_Qa;
  b[3] = (float)(int)((ulong)in_XMM3_Qa >> 0x20);
  b[0] = (float)local_18 * local_148;
  b[1] = (float)local_18 * fStack_144;
  c_00[2] = (float)(int)in_XMM5_Qa;
  c_00[3] = (float)(int)((ulong)in_XMM5_Qa >> 0x20);
  c_00[0] = (float)(int)in_XMM4_Qa;
  c_00[1] = (float)(int)((ulong)in_XMM4_Qa >> 0x20);
  local_240 = local_3e0;
  local_190 = local_3e0;
  local_48 = local_278;
  uStack_40 = uStack_270;
  local_38 = local_298;
  uStack_30 = uStack_290;
  local_28 = local_288;
  uStack_20 = uStack_280;
  local_18 = local_278;
  uStack_10 = uStack_270;
  afVar2 = glmm_fmadd(afVar2,b,c_00);
  local_2a8 = afVar2._0_8_;
  local_58 = local_288;
  uVar1 = local_58;
  uStack_50 = uStack_280;
  local_58._4_4_ = (undefined4)((ulong)local_288 >> 0x20);
  local_e8 = local_58._4_4_;
  uStack_e4 = local_58._4_4_;
  uStack_e0 = local_58._4_4_;
  uStack_dc = local_58._4_4_;
  a[1] = (float)local_58._4_4_;
  a[0] = (float)local_58._4_4_;
  a[2] = (float)(undefined4)local_268;
  a[3] = (float)local_268._4_4_;
  b_00[2] = (float)(int)in_XMM3_Qa;
  b_00[3] = (float)(int)((ulong)in_XMM3_Qa >> 0x20);
  b_00[0] = (float)(undefined4)local_2b8;
  b_00[1] = (float)local_2b8._4_4_;
  c_01[2] = (float)(int)in_XMM5_Qa;
  c_01[3] = (float)(int)((ulong)in_XMM5_Qa >> 0x20);
  c_01[0] = (float)(int)in_XMM4_Qa;
  c_01[1] = (float)(int)((ulong)in_XMM4_Qa >> 0x20);
  local_58 = uVar1;
  afVar2 = glmm_fmadd(a,b_00,c_01);
  local_2b8 = afVar2._0_8_;
  local_68 = local_298;
  uVar1 = local_68;
  uStack_60 = uStack_290;
  local_68._4_4_ = (undefined4)((ulong)local_298 >> 0x20);
  local_f8 = local_68._4_4_;
  uStack_f4 = local_68._4_4_;
  uStack_f0 = local_68._4_4_;
  uStack_ec = local_68._4_4_;
  a_00[1] = (float)local_68._4_4_;
  a_00[0] = (float)local_68._4_4_;
  a_00[2] = (float)(undefined4)local_268;
  a_00[3] = (float)local_268._4_4_;
  b_01[2] = (float)(int)in_XMM3_Qa;
  b_01[3] = (float)(int)((ulong)in_XMM3_Qa >> 0x20);
  b_01[0] = (float)(undefined4)local_2c8;
  b_01[1] = (float)local_2c8._4_4_;
  c_02[2] = (float)(int)in_XMM5_Qa;
  c_02[3] = (float)(int)((ulong)in_XMM5_Qa >> 0x20);
  c_02[0] = (float)(int)in_XMM4_Qa;
  c_02[1] = (float)(int)((ulong)in_XMM4_Qa >> 0x20);
  local_68 = uVar1;
  afVar2 = glmm_fmadd(a_00,b_01,c_02);
  local_2c8 = afVar2._0_8_;
  local_1b8 = local_240 + 8;
  local_268 = *(undefined8 *)local_1b8;
  uStack_260 = *(undefined8 *)(local_240 + 10);
  local_78 = local_278;
  uStack_70 = uStack_270;
  uVar1 = uStack_70;
  uStack_70._0_4_ = (undefined4)uStack_270;
  local_108 = (undefined4)uStack_70;
  uStack_104 = (undefined4)uStack_70;
  uStack_100 = (undefined4)uStack_70;
  uStack_fc = (undefined4)uStack_70;
  a_01[1] = (float)(undefined4)uStack_70;
  a_01[0] = (float)(undefined4)uStack_70;
  a_01[2] = (float)(int)local_268;
  a_01[3] = (float)(int)((ulong)local_268 >> 0x20);
  b_02[2] = (float)(int)in_XMM3_Qa;
  b_02[3] = (float)(int)((ulong)in_XMM3_Qa >> 0x20);
  b_02[0] = (float)(undefined4)local_2a8;
  b_02[1] = (float)local_2a8._4_4_;
  c_03[2] = (float)(int)in_XMM5_Qa;
  c_03[3] = (float)(int)((ulong)in_XMM5_Qa >> 0x20);
  c_03[0] = (float)(int)in_XMM4_Qa;
  c_03[1] = (float)(int)((ulong)in_XMM4_Qa >> 0x20);
  uStack_70 = uVar1;
  afVar2 = glmm_fmadd(a_01,b_02,c_03);
  local_2a8 = afVar2._0_8_;
  local_88 = local_288;
  uStack_80 = uStack_280;
  uVar1 = uStack_80;
  uStack_80._0_4_ = (undefined4)uStack_280;
  local_118 = (undefined4)uStack_80;
  uStack_114 = (undefined4)uStack_80;
  uStack_110 = (undefined4)uStack_80;
  uStack_10c = (undefined4)uStack_80;
  a_02[1] = (float)(undefined4)uStack_80;
  a_02[0] = (float)(undefined4)uStack_80;
  a_02[2] = (float)(undefined4)local_268;
  a_02[3] = (float)local_268._4_4_;
  b_03[2] = (float)(int)in_XMM3_Qa;
  b_03[3] = (float)(int)((ulong)in_XMM3_Qa >> 0x20);
  b_03[0] = (float)(undefined4)local_2b8;
  b_03[1] = (float)local_2b8._4_4_;
  c_04[2] = (float)(int)in_XMM5_Qa;
  c_04[3] = (float)(int)((ulong)in_XMM5_Qa >> 0x20);
  c_04[0] = (float)(int)in_XMM4_Qa;
  c_04[1] = (float)(int)((ulong)in_XMM4_Qa >> 0x20);
  uStack_2a0 = extraout_XMM0_Qb;
  uStack_80 = uVar1;
  afVar2 = glmm_fmadd(a_02,b_03,c_04);
  local_2b8 = afVar2._0_8_;
  local_98 = local_298;
  uStack_90 = uStack_290;
  uVar1 = uStack_90;
  uStack_90._0_4_ = (undefined4)uStack_290;
  local_128 = (undefined4)uStack_90;
  uStack_124 = (undefined4)uStack_90;
  uStack_120 = (undefined4)uStack_90;
  uStack_11c = (undefined4)uStack_90;
  a_03[1] = (float)(undefined4)uStack_90;
  a_03[0] = (float)(undefined4)uStack_90;
  a_03[2] = (float)(undefined4)local_268;
  a_03[3] = (float)local_268._4_4_;
  b_04[2] = (float)(int)in_XMM3_Qa;
  b_04[3] = (float)(int)((ulong)in_XMM3_Qa >> 0x20);
  b_04[0] = (float)(undefined4)local_2c8;
  b_04[1] = (float)local_2c8._4_4_;
  c_05[2] = (float)(int)in_XMM5_Qa;
  c_05[3] = (float)(int)((ulong)in_XMM5_Qa >> 0x20);
  c_05[0] = (float)(int)in_XMM4_Qa;
  c_05[1] = (float)(int)((ulong)in_XMM4_Qa >> 0x20);
  uStack_2b0 = extraout_XMM0_Qb_00;
  uStack_90 = uVar1;
  afVar2 = glmm_fmadd(a_03,b_04,c_05);
  *local_250 = local_2a8;
  local_250[1] = uStack_2a0;
  local_250[2] = local_2b8;
  local_250[3] = uStack_2b0;
  local_250[4] = afVar2._0_8_;
  local_250[5] = extraout_XMM0_Qb_01;
  uVar1 = *(undefined8 *)(local_240 + 0xe);
  local_250[6] = *(undefined8 *)(local_240 + 0xc);
  local_250[7] = uVar1;
  *(float *)(local_4c0 + 6) = *(float *)(local_4c0 + 6) + local_4e8;
  *(float *)((long)local_4c0 + 0x34) = *(float *)((long)local_4c0 + 0x34) + local_4e4;
  *(float *)(local_4c0 + 7) = *(float *)(local_4c0 + 7) + local_4e0;
  return;
}

Assistant:

CGLM_EXPORT
void
glmc_rotated_at(mat4 m, vec3 pivot, float angle, vec3 axis) {
  glm_rotated_at(m, pivot, angle, axis);
}